

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_> __thiscall
immutable::rrb_push<immutable::vector<char,false,5>,true,5>
          (immutable *this,ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_> *in,
          vector<char,_false,_5> *element)

{
  atomic<unsigned_int> *paVar1;
  tree_node<immutable::vector<char,_false,_5>,_true> *ptVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  rrb<immutable::vector<char,_false,_5>,_true,_5> *prVar7;
  leaf_node<immutable::vector<char,_false,_5>,_true> *plVar8;
  char *__function;
  ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_> new_rrb;
  ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_5>,_true>_> new_tail;
  ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_> local_38;
  ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_5>,_true>_> local_30;
  vector<char,_false,_5> local_28;
  
  prVar7 = in->ptr;
  if (prVar7 != (rrb<immutable::vector<char,_false,_5>,_true,_5> *)0x0) {
    if (prVar7->tail_len < 0x20) {
      local_28 = (vector<char,_false,_5>)(element->_impl).ptr;
      if (local_28._impl.ptr != (rrb<char,_false,_5> *)0x0) {
        ((rrb<char,_false,_5> *)local_28._impl.ptr)->_ref_count =
             ((rrb<char,_false,_5> *)local_28._impl.ptr)->_ref_count + 1;
      }
      prVar7 = rrb_details::rrb_tail_push<immutable::vector<char,false,5>,true,5>(in,&local_28);
      *(rrb<immutable::vector<char,_false,_5>,_true,_5> **)this = prVar7;
      if (prVar7 != (rrb<immutable::vector<char,_false,_5>,_true,_5> *)0x0) {
        LOCK();
        (prVar7->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
      }
      ref<immutable::rrb<char,_false,_5>_>::~ref(&local_28._impl);
      return (ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_>)
             (rrb<immutable::vector<char,_false,_5>,_true,_5> *)this;
    }
    local_38.ptr = (rrb<immutable::vector<char,_false,_5>,_true,_5> *)malloc(0x28);
    uVar3 = prVar7->cnt;
    uVar4 = prVar7->shift;
    uVar5 = prVar7->tail_len;
    uVar6 = *(undefined4 *)&prVar7->field_0xc;
    ptVar2 = (prVar7->root).ptr;
    ((local_38.ptr)->tail).ptr = (prVar7->tail).ptr;
    ((local_38.ptr)->root).ptr = ptVar2;
    (local_38.ptr)->cnt = uVar3;
    (local_38.ptr)->shift = uVar4;
    (local_38.ptr)->tail_len = uVar5;
    *(undefined4 *)&(local_38.ptr)->field_0xc = uVar6;
    uVar6 = *(undefined4 *)&prVar7->field_0x24;
    (local_38.ptr)->_ref_count =
         (__atomic_base<unsigned_int>)(prVar7->_ref_count).super___atomic_base<unsigned_int>;
    *(undefined4 *)&(local_38.ptr)->field_0x24 = uVar6;
    ptVar2 = ((local_38.ptr)->root).ptr;
    if (ptVar2 != (tree_node<immutable::vector<char,_false,_5>,_true> *)0x0) {
      LOCK();
      paVar1 = &ptVar2->_ref_count;
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
      UNLOCK();
    }
    plVar8 = ((local_38.ptr)->tail).ptr;
    if (plVar8 != (leaf_node<immutable::vector<char,_false,_5>,_true> *)0x0) {
      LOCK();
      paVar1 = &plVar8->_ref_count;
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
      UNLOCK();
    }
    if (local_38.ptr != (rrb<immutable::vector<char,_false,_5>,_true,_5> *)0x0) {
      LOCK();
      ((local_38.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      (local_38.ptr)->cnt = (local_38.ptr)->cnt + 1;
      plVar8 = (leaf_node<immutable::vector<char,_false,_5>,_true> *)malloc(0x20);
      plVar8->type = LEAF_NODE;
      plVar8->len = 1;
      plVar8->child = (vector<char,_false,_5> *)(plVar8 + 1);
      plVar8->guid = 0;
      plVar8[1].type = LEAF_NODE;
      plVar8[1].len = 0;
      vector<char,_false,_5>::vector((vector<char,_false,_5> *)(plVar8 + 1));
      LOCK();
      (plVar8->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      local_30.ptr = plVar8;
      if (plVar8 == (leaf_node<immutable::vector<char,_false,_5>,_true> *)0x0) {
        __function = 
        "T *immutable::ref<immutable::rrb_details::leaf_node<immutable::vector<char, false>, true>>::operator->() const [T = immutable::rrb_details::leaf_node<immutable::vector<char, false>, true>]"
        ;
        goto LAB_00142946;
      }
      ref<immutable::rrb<char,_false,_5>_>::operator=(&plVar8->child->_impl,&element->_impl);
      if (local_38.ptr != (rrb<immutable::vector<char,_false,_5>,_true,_5> *)0x0) {
        (local_38.ptr)->tail_len = 1;
        rrb_details::push_down_tail<immutable::vector<char,false,5>,true,5>
                  ((rrb_details *)this,in,&local_38,&local_30);
        ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_5>,_true>_>::~ref
                  (&local_30);
        rrb_details::release<immutable::vector<char,false,5>,5>(local_38.ptr);
        return (ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_>)
               (rrb<immutable::vector<char,_false,_5>,_true,_5> *)this;
      }
    }
  }
  __function = 
  "T *immutable::ref<immutable::rrb<immutable::vector<char, false>>>::operator->() const [T = immutable::rrb<immutable::vector<char, false>>]"
  ;
LAB_00142946:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }